

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

container_t *
containerptr_roaring_bitmap_add(roaring_bitmap_t *r,uint32_t val,uint8_t *type,int *index)

{
  ushort uVar1;
  int iVar2;
  uint16_t *puVar3;
  uint8_t *puVar4;
  bool bVar5;
  shared_container_t *sc;
  container_t *pcVar6;
  array_container_t *c;
  container_t *c_00;
  ushort key;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint8_t new_type;
  uint8_t local_39;
  uint *local_38;
  
  iVar2 = (r->high_low_container).size;
  key = (ushort)(val >> 0x10);
  if (((long)iVar2 == 0) || (puVar3 = (r->high_low_container).keys, puVar3[(long)iVar2 + -1] == key)
     ) {
    uVar8 = iVar2 - 1;
  }
  else {
    uVar9 = iVar2 - 1;
    uVar7 = 0;
    uVar10 = uVar9;
    do {
      if ((int)uVar9 < (int)uVar7) {
        uVar8 = ~uVar7;
        break;
      }
      uVar8 = uVar7 + uVar9 >> 1;
      uVar1 = *(ushort *)((long)puVar3 + (ulong)(uVar7 + uVar9 & 0xfffffffe));
      if (uVar1 < key) {
        uVar7 = uVar8 + 1;
        bVar5 = true;
        uVar8 = uVar10;
      }
      else if (key < uVar1) {
        uVar9 = uVar8 - 1;
        bVar5 = true;
        uVar8 = uVar10;
      }
      else {
        bVar5 = false;
      }
      uVar10 = uVar8;
    } while (bVar5);
  }
  local_38 = (uint *)index;
  if ((int)uVar8 < 0) {
    c = array_container_create();
    c_00 = container_add(c,(uint16_t)val,'\x02',type);
    ra_insert_new_key_value_at(&r->high_low_container,~uVar8,key,c_00,*type);
    *local_38 = ~uVar8;
  }
  else {
    uVar10 = uVar8 & 0xffff;
    puVar4 = (r->high_low_container).typecodes;
    sc = (shared_container_t *)(r->high_low_container).containers[uVar10];
    if (puVar4[uVar10] == '\x04') {
      sc = (shared_container_t *)shared_container_extract_copy(sc,puVar4 + uVar10);
    }
    *(shared_container_t **)((long)(r->high_low_container).containers + (ulong)(uVar10 * 8)) = sc;
    local_39 = (r->high_low_container).typecodes[uVar10];
    *type = local_39;
    c_00 = *(container_t **)((long)(r->high_low_container).containers + (ulong)(uVar10 * 8));
    pcVar6 = container_add(c_00,(uint16_t)val,local_39,&local_39);
    *local_38 = uVar8;
    if (pcVar6 != c_00) {
      container_free(c_00,*type);
      (r->high_low_container).containers[uVar8] = pcVar6;
      (r->high_low_container).typecodes[uVar8] = local_39;
      *type = local_39;
      c_00 = pcVar6;
    }
  }
  return c_00;
}

Assistant:

static inline container_t *containerptr_roaring_bitmap_add(roaring_bitmap_t *r,
                                                           uint32_t val,
                                                           uint8_t *type,
                                                           int *index) {
    roaring_array_t *ra = &r->high_low_container;

    uint16_t hb = val >> 16;
    const int i = ra_get_index(ra, hb);
    if (i >= 0) {
        ra_unshare_container_at_index(ra, (uint16_t)i);
        container_t *c = ra_get_container_at_index(ra, (uint16_t)i, type);
        uint8_t new_type = *type;
        container_t *c2 = container_add(c, val & 0xFFFF, *type, &new_type);
        *index = i;
        if (c2 != c) {
            container_free(c, *type);
            ra_set_container_at_index(ra, i, c2, new_type);
            *type = new_type;
            return c2;
        } else {
            return c;
        }
    } else {
        array_container_t *new_ac = array_container_create();
        container_t *c =
            container_add(new_ac, val & 0xFFFF, ARRAY_CONTAINER_TYPE, type);
        // we could just assume that it stays an array container
        ra_insert_new_key_value_at(ra, -i - 1, hb, c, *type);
        *index = -i - 1;
        return c;
    }
}